

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::delete_func(Plotter *this,size_t idx)

{
  size_type sVar1;
  const_iterator __position;
  __normal_iterator<nivalis::Function_*,_std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>_>
  *this_00;
  vector<nivalis::Function,_std::allocator<nivalis::Function>_> *this_01;
  reference pvVar2;
  ulong in_RSI;
  long in_RDI;
  string *unaff_retaddr;
  Environment *in_stack_00000008;
  size_t in_stack_000001a8;
  Plotter *in_stack_000001b0;
  size_t in_stack_000005c8;
  Plotter *in_stack_000005d0;
  value_type *in_stack_ffffffffffffff98;
  deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> *in_stack_ffffffffffffffa0;
  ulong uVar3;
  
  sVar1 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                    ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                     (in_RDI + 0x40));
  if (sVar1 <= in_RSI) {
    return;
  }
  __position._M_current = (Function *)(in_RDI + 0x140);
  std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
            ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)(in_RDI + 0x40),in_RSI
            );
  Environment::del_func(in_stack_00000008,unaff_retaddr);
  sVar1 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                    ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                     (in_RDI + 0x40));
  if (sVar1 < 2) {
    pvVar2 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                       ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                        (in_RDI + 0x40),0);
    std::__cxx11::string::operator=((string *)&pvVar2->expr_str,"");
  }
  else {
    this_00 = (__normal_iterator<nivalis::Function_*,_std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>_>
               *)(in_RDI + 0x2b8);
    std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
              ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)(in_RDI + 0x40),
               in_RSI);
    std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::push_back
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    this_01 = (vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)(in_RDI + 0x40);
    std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::begin
              ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
               in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<nivalis::Function_*,_std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>_>
    ::operator+(this_00,(difference_type)in_stack_ffffffffffffffa0);
    __gnu_cxx::
    __normal_iterator<nivalis::Function_const*,std::vector<nivalis::Function,std::allocator<nivalis::Function>>>
    ::__normal_iterator<nivalis::Function*>
              ((__normal_iterator<const_nivalis::Function_*,_std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>_>
                *)in_stack_ffffffffffffffa0,
               (__normal_iterator<nivalis::Function_*,_std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>_>
                *)in_stack_ffffffffffffff98);
    std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::erase(this_01,__position);
    if (*(ulong *)(in_RDI + 0x30) <= in_RSI) {
      uVar3 = *(ulong *)(in_RDI + 0x30);
      sVar1 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                        ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                         (in_RDI + 0x40));
      if (uVar3 < sVar1) goto LAB_00140d4a;
    }
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + -1;
  }
LAB_00140d4a:
  if (in_RSI == *(ulong *)(in_RDI + 0x30)) {
    set_curr_func(in_stack_000001b0,in_stack_000001a8);
    reparse_expr(in_stack_000005d0,in_stack_000005c8);
  }
  *(undefined1 *)(in_RDI + 0xe0) = 1;
  *(undefined1 *)(in_RDI + 0xe1) = 1;
  return;
}

Assistant:

void Plotter::delete_func(size_t idx) {
    if (idx >= funcs.size()) return;
    env.del_func(funcs[idx].name);
    if (funcs.size() > 1) {
        reuse_colors.push_back(funcs[idx].line_color);
        funcs.erase(funcs.begin() + idx);
        if (curr_func > idx || curr_func >= funcs.size()) {
            curr_func--;
        }
    } else {
        funcs[0].expr_str = "";
    }
    if (idx == curr_func) {
        set_curr_func(curr_func); // Update text without changing index
        reparse_expr(curr_func);
    }
    focus_on_editor = true;
    require_update = true;
}